

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3GenerateRowDelete
               (Parse *pParse,Table *pTab,Trigger *pTrigger,int iDataCur,int iIdxCur,int iPk,i16 nPk
               ,u8 count,u8 onconf,u8 eMode,int iIdxNoSeek)

{
  Vdbe *v;
  Op *pOVar1;
  int *piVar2;
  uint p2;
  int iVar3;
  int iVar4;
  int iVar5;
  u32 uVar6;
  u32 uVar7;
  uint iCol;
  int local_70;
  
  v = pParse->pVdbe;
  p2 = sqlite3VdbeMakeLabel(v);
  iVar3 = (uint)((pTab->tabFlags & 0x20) == 0) * 3 + 0x1c;
  if (eMode == '\0') {
    iVar4 = sqlite3VdbeAddOp3(v,iVar3,iDataCur,p2,iPk);
    if (v->db->mallocFailed == '\0') {
      pOVar1 = v->aOp;
      pOVar1[iVar4].p4type = -3;
      *(int *)&pOVar1[iVar4].p4 = (int)nPk;
    }
  }
  local_70 = iIdxNoSeek;
  iVar4 = 0;
  iVar5 = sqlite3FkRequired(pParse,pTab,(int *)0x0,0);
  if ((pTrigger != (Trigger *)0x0) || (iVar5 != 0)) {
    iCol = 0;
    uVar6 = sqlite3TriggerColmask(pParse,pTrigger,(ExprList *)0x0,0,3,pTab,(uint)onconf);
    uVar7 = sqlite3FkOldmask(pParse,pTab);
    iVar5 = pParse->nMem;
    iVar4 = iVar5 + 1;
    pParse->nMem = iVar5 + 1 + (int)pTab->nCol;
    sqlite3VdbeAddOp3(v,0x4e,iPk,iVar4,0);
    if (0 < pTab->nCol) {
      do {
        if (((uVar7 | uVar6) == 0xffffffff) ||
           ((iCol < 0x20 && (((uVar7 | uVar6) >> (iCol & 0x1f) & 1) != 0)))) {
          sqlite3ExprCodeGetColumnOfTable(v,pTab,iDataCur,iCol,iCol + iVar5 + 2);
        }
        iCol = iCol + 1;
      } while ((int)iCol < (int)pTab->nCol);
    }
    iVar5 = v->nOp;
    sqlite3CodeRowTrigger(pParse,pTrigger,0x75,(ExprList *)0x0,1,pTab,iVar4,(uint)onconf,p2);
    if (iVar5 < v->nOp) {
      iVar3 = sqlite3VdbeAddOp3(v,iVar3,iDataCur,p2,iPk);
      local_70 = -1;
      if (v->db->mallocFailed == '\0') {
        pOVar1 = v->aOp;
        pOVar1[iVar3].p4type = -3;
        *(int *)&pOVar1[iVar3].p4 = (int)nPk;
      }
    }
    sqlite3FkCheck(pParse,pTab,iVar4,0,(int *)0x0,0);
  }
  if (pTab->pSelect != (Select *)0x0) goto LAB_00172d9f;
  sqlite3GenerateRowIndexDelete(pParse,pTab,iDataCur,iIdxCur,(int *)0x0,local_70);
  sqlite3VdbeAddOp3(v,0x7c,iDataCur,(uint)(count != '\0'),0);
  if (pParse->nested == '\0') {
LAB_00172d0a:
    if (v->db->mallocFailed == '\0') {
      pOVar1 = v->aOp;
      iVar3 = v->nOp;
      pOVar1[(long)iVar3 + -1].p4type = -6;
      pOVar1[(long)iVar3 + -1].p4.pTab = pTab;
    }
  }
  else if (pTab->zName != (char *)0x0) {
    iVar3 = sqlite3StrICmp(pTab->zName,"sqlite_stat1");
    if (iVar3 == 0) goto LAB_00172d0a;
  }
  if ((eMode != '\0') && (0 < (long)v->nOp)) {
    v->aOp[(long)v->nOp + -1].p5 = 4;
  }
  if (local_70 != iDataCur && -1 < local_70) {
    sqlite3VdbeAddOp3(v,0x7c,local_70,0,0);
  }
  if (0 < (long)v->nOp) {
    v->aOp[(long)v->nOp + -1].p5 = (ushort)(eMode == '\x02') * 2;
  }
LAB_00172d9f:
  sqlite3FkActions(pParse,pTab,(ExprList *)0x0,iVar4,(int *)0x0,0);
  sqlite3CodeRowTrigger(pParse,pTrigger,0x75,(ExprList *)0x0,2,pTab,iVar4,(uint)onconf,p2);
  piVar2 = v->pParse->aLabel;
  if (piVar2 != (int *)0x0) {
    piVar2[(int)~p2] = v->nOp;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3GenerateRowDelete(
  Parse *pParse,     /* Parsing context */
  Table *pTab,       /* Table containing the row to be deleted */
  Trigger *pTrigger, /* List of triggers to (potentially) fire */
  int iDataCur,      /* Cursor from which column data is extracted */
  int iIdxCur,       /* First index cursor */
  int iPk,           /* First memory cell containing the PRIMARY KEY */
  i16 nPk,           /* Number of PRIMARY KEY memory cells */
  u8 count,          /* If non-zero, increment the row change counter */
  u8 onconf,         /* Default ON CONFLICT policy for triggers */
  u8 eMode,          /* ONEPASS_OFF, _SINGLE, or _MULTI.  See above */
  int iIdxNoSeek     /* Cursor number of cursor that does not need seeking */
){
  Vdbe *v = pParse->pVdbe;        /* Vdbe */
  int iOld = 0;                   /* First register in OLD.* array */
  int iLabel;                     /* Label resolved to end of generated code */
  u8 opSeek;                      /* Seek opcode */

  /* Vdbe is guaranteed to have been allocated by this stage. */
  assert( v );
  VdbeModuleComment((v, "BEGIN: GenRowDel(%d,%d,%d,%d)",
                         iDataCur, iIdxCur, iPk, (int)nPk));

  /* Seek cursor iCur to the row to delete. If this row no longer exists 
  ** (this can happen if a trigger program has already deleted it), do
  ** not attempt to delete it or fire any DELETE triggers.  */
  iLabel = sqlite3VdbeMakeLabel(v);
  opSeek = HasRowid(pTab) ? OP_NotExists : OP_NotFound;
  if( eMode==ONEPASS_OFF ){
    sqlite3VdbeAddOp4Int(v, opSeek, iDataCur, iLabel, iPk, nPk);
    VdbeCoverageIf(v, opSeek==OP_NotExists);
    VdbeCoverageIf(v, opSeek==OP_NotFound);
  }
 
  /* If there are any triggers to fire, allocate a range of registers to
  ** use for the old.* references in the triggers.  */
  if( sqlite3FkRequired(pParse, pTab, 0, 0) || pTrigger ){
    u32 mask;                     /* Mask of OLD.* columns in use */
    int iCol;                     /* Iterator used while populating OLD.* */
    int addrStart;                /* Start of BEFORE trigger programs */

    /* TODO: Could use temporary registers here. Also could attempt to
    ** avoid copying the contents of the rowid register.  */
    mask = sqlite3TriggerColmask(
        pParse, pTrigger, 0, 0, TRIGGER_BEFORE|TRIGGER_AFTER, pTab, onconf
    );
    mask |= sqlite3FkOldmask(pParse, pTab);
    iOld = pParse->nMem+1;
    pParse->nMem += (1 + pTab->nCol);

    /* Populate the OLD.* pseudo-table register array. These values will be 
    ** used by any BEFORE and AFTER triggers that exist.  */
    sqlite3VdbeAddOp2(v, OP_Copy, iPk, iOld);
    for(iCol=0; iCol<pTab->nCol; iCol++){
      testcase( mask!=0xffffffff && iCol==31 );
      testcase( mask!=0xffffffff && iCol==32 );
      if( mask==0xffffffff || (iCol<=31 && (mask & MASKBIT32(iCol))!=0) ){
        sqlite3ExprCodeGetColumnOfTable(v, pTab, iDataCur, iCol, iOld+iCol+1);
      }
    }

    /* Invoke BEFORE DELETE trigger programs. */
    addrStart = sqlite3VdbeCurrentAddr(v);
    sqlite3CodeRowTrigger(pParse, pTrigger, 
        TK_DELETE, 0, TRIGGER_BEFORE, pTab, iOld, onconf, iLabel
    );

    /* If any BEFORE triggers were coded, then seek the cursor to the 
    ** row to be deleted again. It may be that the BEFORE triggers moved
    ** the cursor or already deleted the row that the cursor was
    ** pointing to.
    **
    ** Also disable the iIdxNoSeek optimization since the BEFORE trigger
    ** may have moved that cursor.
    */
    if( addrStart<sqlite3VdbeCurrentAddr(v) ){
      sqlite3VdbeAddOp4Int(v, opSeek, iDataCur, iLabel, iPk, nPk);
      VdbeCoverageIf(v, opSeek==OP_NotExists);
      VdbeCoverageIf(v, opSeek==OP_NotFound);
      testcase( iIdxNoSeek>=0 );
      iIdxNoSeek = -1;
    }

    /* Do FK processing. This call checks that any FK constraints that
    ** refer to this table (i.e. constraints attached to other tables) 
    ** are not violated by deleting this row.  */
    sqlite3FkCheck(pParse, pTab, iOld, 0, 0, 0);
  }

  /* Delete the index and table entries. Skip this step if pTab is really
  ** a view (in which case the only effect of the DELETE statement is to
  ** fire the INSTEAD OF triggers).  
  **
  ** If variable 'count' is non-zero, then this OP_Delete instruction should
  ** invoke the update-hook. The pre-update-hook, on the other hand should
  ** be invoked unless table pTab is a system table. The difference is that
  ** the update-hook is not invoked for rows removed by REPLACE, but the 
  ** pre-update-hook is.
  */ 
  if( pTab->pSelect==0 ){
    u8 p5 = 0;
    sqlite3GenerateRowIndexDelete(pParse, pTab, iDataCur, iIdxCur,0,iIdxNoSeek);
    sqlite3VdbeAddOp2(v, OP_Delete, iDataCur, (count?OPFLAG_NCHANGE:0));
    if( pParse->nested==0 || 0==sqlite3_stricmp(pTab->zName, "sqlite_stat1") ){
      sqlite3VdbeAppendP4(v, (char*)pTab, P4_TABLE);
    }
    if( eMode!=ONEPASS_OFF ){
      sqlite3VdbeChangeP5(v, OPFLAG_AUXDELETE);
    }
    if( iIdxNoSeek>=0 && iIdxNoSeek!=iDataCur ){
      sqlite3VdbeAddOp1(v, OP_Delete, iIdxNoSeek);
    }
    if( eMode==ONEPASS_MULTI ) p5 |= OPFLAG_SAVEPOSITION;
    sqlite3VdbeChangeP5(v, p5);
  }

  /* Do any ON CASCADE, SET NULL or SET DEFAULT operations required to
  ** handle rows (possibly in other tables) that refer via a foreign key
  ** to the row just deleted. */ 
  sqlite3FkActions(pParse, pTab, 0, iOld, 0, 0);

  /* Invoke AFTER DELETE trigger programs. */
  sqlite3CodeRowTrigger(pParse, pTrigger, 
      TK_DELETE, 0, TRIGGER_AFTER, pTab, iOld, onconf, iLabel
  );

  /* Jump here if the row had already been deleted before any BEFORE
  ** trigger programs were invoked. Or if a trigger program throws a 
  ** RAISE(IGNORE) exception.  */
  sqlite3VdbeResolveLabel(v, iLabel);
  VdbeModuleComment((v, "END: GenRowDel()"));
}